

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void BuildAndStoreCommandPrefixCode
               (uint32_t *histogram,uint8_t *depth,uint16_t *bits,size_t *storage_ix,
               uint8_t *storage)

{
  ulong local_780;
  size_t i;
  uint16_t cmd_bits [64];
  uint8_t cmd_depth [704];
  HuffmanTree tree [129];
  uint8_t *storage_local;
  size_t *storage_ix_local;
  uint16_t *bits_local;
  uint8_t *depth_local;
  uint32_t *histogram_local;
  
  memset(cmd_bits + 0x3c,0,0x2c0);
  BrotliCreateHuffmanTree(histogram,0x40,0xf,(HuffmanTree *)(cmd_depth + 0x2b8),depth);
  BrotliCreateHuffmanTree(histogram + 0x40,0x40,0xe,(HuffmanTree *)(cmd_depth + 0x2b8),depth + 0x40)
  ;
  cmd_bits._120_8_ = *(undefined8 *)(depth + 0x18);
  cmd_depth._0_8_ = *(undefined8 *)(depth + 0x20);
  cmd_depth._8_8_ = *(undefined8 *)(depth + 0x28);
  cmd_depth._16_8_ = *(undefined8 *)depth;
  cmd_depth._24_8_ = *(undefined8 *)(depth + 0x30);
  cmd_depth._32_8_ = *(undefined8 *)(depth + 8);
  cmd_depth._40_8_ = *(undefined8 *)(depth + 0x38);
  cmd_depth._48_8_ = *(undefined8 *)(depth + 0x10);
  BrotliConvertBitDepthsToSymbols((uint8_t *)(cmd_bits + 0x3c),0x40,(uint16_t *)&i);
  *(undefined8 *)bits = cmd_bits._40_8_;
  *(undefined8 *)(bits + 4) = cmd_bits._48_8_;
  *(undefined8 *)(bits + 8) = cmd_bits._72_8_;
  *(undefined8 *)(bits + 0xc) = cmd_bits._80_8_;
  *(undefined8 *)(bits + 0x10) = cmd_bits._104_8_;
  *(undefined8 *)(bits + 0x14) = cmd_bits._112_8_;
  memcpy(bits + 0x18,&i,0x30);
  *(undefined8 *)(bits + 0x30) = cmd_bits._56_8_;
  *(undefined8 *)(bits + 0x34) = cmd_bits._64_8_;
  *(undefined8 *)(bits + 0x38) = cmd_bits._88_8_;
  *(undefined8 *)(bits + 0x3c) = cmd_bits._96_8_;
  BrotliConvertBitDepthsToSymbols(depth + 0x40,0x40,bits + 0x40);
  memset(cmd_bits + 0x3c,0,0x40);
  cmd_bits._120_8_ = *(undefined8 *)(depth + 0x18);
  cmd_depth._56_8_ = *(undefined8 *)(depth + 0x20);
  cmd_depth._120_8_ = *(undefined8 *)(depth + 0x28);
  cmd_depth._184_8_ = *(undefined8 *)(depth + 0x30);
  cmd_depth._376_8_ = *(undefined8 *)(depth + 0x38);
  for (local_780 = 0; local_780 < 8; local_780 = local_780 + 1) {
    *(uint8_t *)&tree[local_780 - 0x49].total_count_ = depth[local_780];
    *(uint8_t *)&tree[local_780 - 0x39].total_count_ = depth[local_780 + 8];
    *(uint8_t *)&tree[local_780 - 0x21].total_count_ = depth[local_780 + 0x10];
  }
  BrotliStoreHuffmanTree
            ((uint8_t *)(cmd_bits + 0x3c),0x2c0,(HuffmanTree *)(cmd_depth + 0x2b8),storage_ix,
             storage);
  BrotliStoreHuffmanTree(depth + 0x40,0x40,(HuffmanTree *)(cmd_depth + 0x2b8),storage_ix,storage);
  return;
}

Assistant:

static void BuildAndStoreCommandPrefixCode(const uint32_t histogram[128],
    uint8_t depth[128], uint16_t bits[128], size_t* storage_ix,
    uint8_t* storage) {
  /* Tree size for building a tree over 64 symbols is 2 * 64 + 1. */
  HuffmanTree tree[129];
  uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS] = { 0 };
  uint16_t cmd_bits[64];

  BrotliCreateHuffmanTree(histogram, 64, 15, tree, depth);
  BrotliCreateHuffmanTree(&histogram[64], 64, 14, tree, &depth[64]);
  /* We have to jump through a few hoops here in order to compute
     the command bits because the symbols are in a different order than in
     the full alphabet. This looks complicated, but having the symbols
     in this order in the command bits saves a few branches in the Emit*
     functions. */
  memcpy(cmd_depth, depth, 24);
  memcpy(cmd_depth + 24, depth + 40, 8);
  memcpy(cmd_depth + 32, depth + 24, 8);
  memcpy(cmd_depth + 40, depth + 48, 8);
  memcpy(cmd_depth + 48, depth + 32, 8);
  memcpy(cmd_depth + 56, depth + 56, 8);
  BrotliConvertBitDepthsToSymbols(cmd_depth, 64, cmd_bits);
  memcpy(bits, cmd_bits, 48);
  memcpy(bits + 24, cmd_bits + 32, 16);
  memcpy(bits + 32, cmd_bits + 48, 16);
  memcpy(bits + 40, cmd_bits + 24, 16);
  memcpy(bits + 48, cmd_bits + 40, 16);
  memcpy(bits + 56, cmd_bits + 56, 16);
  BrotliConvertBitDepthsToSymbols(&depth[64], 64, &bits[64]);
  {
    /* Create the bit length array for the full command alphabet. */
    size_t i;
    memset(cmd_depth, 0, 64);  /* only 64 first values were used */
    memcpy(cmd_depth, depth, 8);
    memcpy(cmd_depth + 64, depth + 8, 8);
    memcpy(cmd_depth + 128, depth + 16, 8);
    memcpy(cmd_depth + 192, depth + 24, 8);
    memcpy(cmd_depth + 384, depth + 32, 8);
    for (i = 0; i < 8; ++i) {
      cmd_depth[128 + 8 * i] = depth[40 + i];
      cmd_depth[256 + 8 * i] = depth[48 + i];
      cmd_depth[448 + 8 * i] = depth[56 + i];
    }
    BrotliStoreHuffmanTree(
        cmd_depth, BROTLI_NUM_COMMAND_SYMBOLS, tree, storage_ix, storage);
  }
  BrotliStoreHuffmanTree(&depth[64], 64, tree, storage_ix, storage);
}